

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

void * bsclose(bStream *s)

{
  void *pvVar1;
  
  if (s == (bStream *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    s->readFnPtr = (bNread)0x0;
    if (s->buff != (bstring)0x0) {
      bdestroy(s->buff);
    }
    pvVar1 = s->parm;
    s->buff = (bstring)0x0;
    s->parm = (void *)0x0;
    s->isEOF = 1;
    free(s);
  }
  return pvVar1;
}

Assistant:

void * bsclose (struct bStream * s) {
void * parm;
	if (s == NULL) return NULL;
	s->readFnPtr = NULL;
	if (s->buff) bdestroy (s->buff);
	s->buff = NULL;
	parm = s->parm;
	s->parm = NULL;
	s->isEOF = 1;
	bstr__free (s);
	return parm;
}